

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O0

void Abc_NtkRetimeNode(Abc_Obj_t *pObj,int fForward,int fInitial)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  char *pName;
  int local_3c;
  int i;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pNext;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtkNew;
  int fInitial_local;
  int fForward_local;
  Abc_Obj_t *pObj_local;
  
  vNodes = (Vec_Ptr_t *)0x0;
  vNodes_00 = Vec_PtrAlloc(10);
  if (fForward == 0) {
    if (fInitial != 0) {
      pAVar2 = Abc_ObjFanout0(pObj);
      vNodes = (Vec_Ptr_t *)((pAVar2->field_6).pCopy)->pNtk;
      Abc_NtkDupObj((Abc_Ntk_t *)vNodes,pObj,0);
      for (local_3c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_3c < iVar1; local_3c = local_3c + 1)
      {
        pAVar2 = Abc_ObjFanout(pObj,local_3c);
        iVar1 = Abc_ObjFaninNum((pAVar2->field_6).pCopy);
        if (iVar1 != 0) {
          __assert_fail("Abc_ObjFaninNum(pNext->pCopy) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retIncrem.c"
                        ,0x163,"void Abc_NtkRetimeNode(Abc_Obj_t *, int, int)");
        }
        Abc_ObjAddFanin((pAVar2->field_6).pCopy,(pObj->field_6).pCopy);
      }
    }
    Abc_NodeCollectFanouts(pObj,vNodes_00);
    for (local_3c = 0; iVar1 = Vec_PtrSize(vNodes_00), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,local_3c);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsLatch(pNext)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retIncrem.c"
                      ,0x16c,"void Abc_NtkRetimeNode(Abc_Obj_t *, int, int)");
      }
      Abc_ObjTransferFanout(pAVar2,pObj);
      Abc_NtkDeleteObj(pAVar2);
    }
    for (local_3c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar2 = Abc_ObjFanin(pObj,local_3c);
      pAVar3 = Abc_NtkCreateLatch(pObj->pNtk);
      Abc_ObjPatchFanin(pObj,pAVar2,pAVar3);
      Abc_ObjAddFanin(pAVar3,pAVar2);
      if (fInitial != 0) {
        pAVar4 = Abc_NtkCreateNodeBuf((Abc_Ntk_t *)vNodes,(Abc_Obj_t *)0x0);
        (pAVar3->field_6).pCopy = pAVar4;
        pAVar4 = (pAVar3->field_6).pCopy;
        pName = Abc_ObjName(pAVar2);
        Abc_ObjAssignName(pAVar4,pName,"_buf");
        Abc_ObjAddFanin((pObj->field_6).pCopy,(pAVar3->field_6).pCopy);
      }
    }
  }
  else {
    if (fInitial != 0) {
      iVar1 = Abc_ObjSopSimulate(pObj);
      pObj->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar1;
    }
    Abc_NodeCollectFanins(pObj,vNodes_00);
    for (local_3c = 0; iVar1 = Vec_PtrSize(vNodes_00), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,local_3c);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsLatch(pNext)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retIncrem.c"
                      ,0x14c,"void Abc_NtkRetimeNode(Abc_Obj_t *, int, int)");
      }
      pAVar3 = Abc_ObjFanin0(pAVar2);
      Abc_ObjPatchFanin(pObj,pAVar2,pAVar3);
      iVar1 = Abc_ObjFanoutNum(pAVar2);
      if (iVar1 == 0) {
        Abc_NtkDeleteObj(pAVar2);
      }
    }
    pAVar2 = Abc_NtkCreateLatch(pObj->pNtk);
    iVar1 = Abc_ObjFanoutNum(pObj);
    if (0 < iVar1) {
      Abc_ObjTransferFanout(pObj,pAVar2);
    }
    Abc_ObjAddFanin(pAVar2,pObj);
    if (fInitial != 0) {
      pAVar2->field_6 = pObj->field_6;
    }
  }
  Vec_PtrFree(vNodes_00);
  return;
}

Assistant:

void Abc_NtkRetimeNode( Abc_Obj_t * pObj, int fForward, int fInitial )
{
    Abc_Ntk_t * pNtkNew = NULL;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNext, * pLatch;
    int i;
    vNodes = Vec_PtrAlloc( 10 );
    if ( fForward ) 
    {
        // compute the initial value
        if ( fInitial )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_ObjSopSimulate( pObj );
        // collect fanins
        Abc_NodeCollectFanins( pObj, vNodes );
        // make the node point to the fanins fanins
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, i )
        {
            assert( Abc_ObjIsLatch(pNext) );
            Abc_ObjPatchFanin( pObj, pNext, Abc_ObjFanin0(pNext) );
            if ( Abc_ObjFanoutNum(pNext) == 0 )
                Abc_NtkDeleteObj(pNext);            
        }
        // add a new latch on top
        pNext = Abc_NtkCreateLatch(pObj->pNtk);
        if ( Abc_ObjFanoutNum(pObj) > 0 )
            Abc_ObjTransferFanout( pObj, pNext );
        Abc_ObjAddFanin( pNext, pObj );
        // set the initial value
        if ( fInitial )
            pNext->pCopy = pObj->pCopy;
    }
    else
    {
        // compute the initial value
        if ( fInitial )
        {
            pNtkNew = Abc_ObjFanout0(pObj)->pCopy->pNtk;
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjForEachFanout( pObj, pNext, i )
            {
                assert( Abc_ObjFaninNum(pNext->pCopy) == 0 );
                Abc_ObjAddFanin( pNext->pCopy, pObj->pCopy );
            }
        }
        // collect fanouts
        Abc_NodeCollectFanouts( pObj, vNodes );
        // make the fanouts fanouts point to the node
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, i )
        {
            assert( Abc_ObjIsLatch(pNext) );
            Abc_ObjTransferFanout( pNext, pObj );
            Abc_NtkDeleteObj( pNext );  
        }
        // add new latches to the fanins
        Abc_ObjForEachFanin( pObj, pNext, i )
        {
            pLatch = Abc_NtkCreateLatch(pObj->pNtk);
            Abc_ObjPatchFanin( pObj, pNext, pLatch );
            Abc_ObjAddFanin( pLatch, pNext );
            // create buffer isomorphic to this latch
            if ( fInitial )
            {
                pLatch->pCopy = Abc_NtkCreateNodeBuf( pNtkNew, NULL );
                Abc_ObjAssignName( pLatch->pCopy, Abc_ObjName(pNext), "_buf" );
                Abc_ObjAddFanin( pObj->pCopy, pLatch->pCopy );
            }
        }
    }
    Vec_PtrFree( vNodes );
}